

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  Expr *pEVar1;
  Module *pMVar2;
  pointer ppDVar3;
  DataSegment *pDVar4;
  pointer pcVar5;
  pointer pNVar6;
  Node *n;
  undefined8 uVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  size_t sVar11;
  pointer puVar12;
  ulong uVar13;
  char *__function;
  char cVar14;
  pointer puVar15;
  _Alloc_hider _Var16;
  Opcode OVar17;
  undefined4 in_register_00000084;
  Address AVar18;
  char cVar19;
  pointer ppDVar20;
  Enum EVar21;
  bool bVar22;
  string index;
  Value ival;
  string __str;
  string access;
  string local_138;
  string local_118;
  undefined1 local_f8 [48];
  Address local_c8;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  char *local_38;
  
  OVar17.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_(&local_58,&this->lst,offset,addr_exp);
  if ((local_58._M_string_length == 0) ||
     (iVar9 = std::__cxx11::string::compare((char *)&local_58), iVar9 == 0)) {
    pEVar1 = addr_exp->e;
    local_78.field_2._8_8_ = local_58._M_string_length;
    if ((pEVar1 != (Expr *)0x0) && (pEVar1->type_ == Const)) {
      iVar9 = *(int *)&pEVar1[1].loc.filename._M_str;
      if (iVar9 == -2) {
        uVar10 = *(ulong *)((long)&pEVar1[1].loc.field_1 + 8);
      }
      else {
        if (iVar9 != -1) goto LAB_001328ce;
        uVar10 = (ulong)(uint)pEVar1[1].loc.field_1.field_0.last_column;
      }
      pMVar2 = (this->mc).module;
      ppDVar20 = (pMVar2->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppDVar3 = (pMVar2->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppDVar20 != ppDVar3) {
        puVar15 = (pointer)(uVar10 + offset);
        do {
          pDVar4 = *ppDVar20;
          if ((((pDVar4->offset).size_ == 1) &&
              (pEVar1 = (pDVar4->offset).first_, pEVar1 != (Expr *)0x0)) && (pEVar1->type_ == Const)
             ) {
            iVar9 = *(int *)&pEVar1[1].loc.filename._M_str;
            if (iVar9 == -2) {
              puVar12 = *(pointer *)((long)&pEVar1[1].loc.field_1 + 8);
            }
            else {
              if (iVar9 != -1) goto LAB_001328c1;
              puVar12 = (pointer)(ulong)(uint)pEVar1[1].loc.field_1.field_0.last_column;
            }
            if ((puVar12 <= puVar15) &&
               (puVar15 < (pDVar4->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                          ((long)puVar12 -
                          (long)(pDVar4->data).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start))) {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              pcVar5 = (pDVar4->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,pcVar5,pcVar5 + (pDVar4->name)._M_string_length);
              local_a8._16_8_ = (pointer)0x0;
              local_a8._0_8_ = (pointer)0x0;
              local_a8._8_8_ = (pointer)0x0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_a8,&local_138,&local_118);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_f8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a8);
              local_f8._24_4_ = Atomic;
              local_78._M_dataplus._M_p =
                   (pointer)(val->v).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
              local_88._M_allocated_capacity =
                   (size_type)
                   (val->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_88._8_8_ =
                   (val->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_f8._8_8_ = (pointer)0x0;
              local_f8._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_88);
              val->precedence = local_f8._24_4_;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8);
              offset = (long)puVar15 - (long)puVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                (ulong)(local_138.field_2._M_allocated_capacity + 1));
              }
            }
          }
LAB_001328c1:
          ppDVar20 = ppDVar20 + 1;
        } while (ppDVar20 != ppDVar3);
      }
    }
LAB_001328ce:
    uVar10 = offset / align;
    if (offset % align == 0) {
      cVar14 = '\x01';
      if (9 < uVar10) {
        uVar13 = uVar10;
        cVar19 = '\x04';
        do {
          cVar14 = cVar19;
          if (uVar13 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_00132aac;
          }
          if (uVar13 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_00132aac;
          }
          if (uVar13 < 10000) goto LAB_00132aac;
          bVar22 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar19 = cVar14 + '\x04';
        } while (bVar22);
        cVar14 = cVar14 + '\x01';
      }
LAB_00132aac:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,uVar10);
    }
    else {
      cVar19 = '\x01';
      cVar14 = '\x01';
      if (9 < offset) {
        uVar10 = offset;
        cVar8 = '\x04';
        do {
          cVar14 = cVar8;
          if (uVar10 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_001329b9;
          }
          if (uVar10 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_001329b9;
          }
          if (uVar10 < 10000) goto LAB_001329b9;
          bVar22 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar8 = cVar14 + '\x04';
        } while (bVar22);
        cVar14 = cVar14 + '\x01';
      }
LAB_001329b9:
      local_88._M_allocated_capacity = (size_type)&local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_88._M_allocated_capacity,local_88._8_4_,offset);
      if (9 < align) {
        AVar18 = align;
        cVar14 = '\x04';
        do {
          cVar19 = cVar14;
          if (AVar18 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00132a50;
          }
          if (AVar18 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00132a50;
          }
          if (AVar18 < 10000) goto LAB_00132a50;
          bVar22 = 99999 < AVar18;
          AVar18 = AVar18 / 10000;
          cVar14 = cVar19 + '\x04';
        } while (bVar22);
        cVar19 = cVar19 + '\x01';
      }
LAB_00132a50:
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_a8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8._0_8_,local_a8._8_4_,align);
      cat<std::__cxx11::string,char[2],std::__cxx11::string>
                (&local_138,(wabt *)local_88._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"@",
                 (char (*) [2])local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,OVar17.enum_));
    }
    uVar7 = local_78.field_2._8_8_;
    if (offset % align != 0) {
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_a8._16_8_)->_M_p + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,
                        (ulong)(local_78._M_dataplus._M_p + 1));
      }
    }
    if (addr_exp->etype != Binary) goto LAB_00132c88;
    if (addr_exp->e->type_ != Binary) {
LAB_00132f59:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
      goto LAB_00132f6e;
    }
    if ((*(int *)&addr_exp->e->field_0x3c != 0x60) ||
       (pNVar6 = (addr_exp->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start, pNVar6[1].etype != Binary))
    goto LAB_00132c88;
    if ((pNVar6[1].e)->type_ != Binary) goto LAB_00132f59;
    if ((*(int *)&(pNVar6[1].e)->field_0x3c == 0x6a) &&
       (n = pNVar6[1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start, n[1].etype == Const)) {
      pEVar1 = n[1].e;
      if (pEVar1->type_ == Const) {
        if ((*(int *)&pEVar1[1].loc.filename._M_str == -1) &&
           (1L << (pEVar1[1].loc.field_1.field2[8] & 0x3f) == align)) {
          DecompileExpr((Value *)local_f8,this,n,pNVar6 + 1);
          if (local_f8._8_8_ - local_f8._0_8_ == 0x20) {
            if (offset == 0) {
              std::__cxx11::string::_M_assign((string *)&local_138);
            }
            else {
              BracketIfNeeded(this,(Value *)local_f8,Add);
              cat<std::__cxx11::string,char[4],std::__cxx11::string>
                        (&local_118,(wabt *)local_f8._0_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                         (char (*) [4])&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000084,OVar17.enum_));
              std::__cxx11::string::operator=((string *)&local_138,(string *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
                  &local_118.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_118._M_dataplus._M_p._4_4_,
                                         local_118._M_dataplus._M_p._0_4_),
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            DecompileExpr((Value *)&local_118,this,
                          (addr_exp->children).
                          super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                          super__Vector_impl_data._M_start,addr_exp);
            Value::operator=(val,(Value *)&local_118);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_118);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f8);
        }
        goto LAB_00132c88;
      }
LAB_00132f90:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
LAB_00132f6e:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x48,__function);
    }
LAB_00132c88:
    BracketIfNeeded(this,val,Indexing);
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)local_f8,(wabt *)0x15d843,(char (*) [2])&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1562d8,
               (char (*) [2])CONCAT44(in_register_00000084,OVar17.enum_));
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if (uVar7 == 0) {
      EVar21 = op_type.enum_;
      local_118._M_dataplus._M_p._0_4_ = opc.enum_;
      if ((EVar21 & I64) == I64) {
        Opcode::GetInfo((Info *)local_f8,(Opcode *)&local_118);
        uVar7 = local_f8._0_8_;
        sVar11 = strlen((char *)local_f8._0_8_);
        if (sVar11 < 2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     sVar11 - 2,sVar11);
          goto LAB_00132f90;
        }
        bVar22 = *(short *)(uVar7 + (sVar11 - 2)) != 0x755f;
        Opcode::GetInfo((Info *)local_f8,(Opcode *)&local_118);
        if (local_c8 == 4) {
          EVar21 = I32U;
          if (bVar22) {
            EVar21 = I32;
          }
        }
        else if (local_c8 == 2) {
          EVar21 = I16;
          if (!bVar22) {
            EVar21 = I16U;
          }
        }
        else if (local_c8 == 1) {
          EVar21 = I8U;
          if (bVar22) {
            EVar21 = I8;
          }
        }
      }
      switch(EVar21) {
      case I8U:
        local_38 = "ubyte";
        break;
      case I16U:
        local_38 = "ushort";
        break;
      case I32U:
        local_38 = "uint";
        break;
      case ExternRef:
        local_38 = "externref";
        break;
      case FuncRef:
        local_38 = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_00132dd4_caseD_fffffff1:
        local_38 = "ILLEGAL";
        break;
      case I16:
        local_38 = "short";
        break;
      case I8:
        local_38 = "byte";
        break;
      case V128:
        local_38 = "simd";
        break;
      case F64:
        local_38 = "double";
        break;
      case F32:
        local_38 = "float";
        break;
      case I64:
        local_38 = "long";
        break;
      case I32:
        local_38 = "int";
        break;
      default:
        if (EVar21 == Void) {
          local_38 = "void";
        }
        else {
          if (EVar21 != Func) goto switchD_00132dd4_caseD_fffffff1;
          local_38 = "func";
        }
      }
      LoadStoreTracking::GenAlign_abi_cxx11_(&local_118,&this->lst,align,opc);
      cat<char[2],char_const*,std::__cxx11::string>
                ((string *)local_f8,(wabt *)":",(char (*) [2])&local_38,(char **)&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,OVar17.enum_));
      std::__cxx11::string::_M_append
                ((char *)((val->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
          &local_118.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_),
                        local_118.field_2._M_allocated_capacity + 1);
      }
    }
    val->precedence = Indexing;
    _Var16._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00132f26;
  }
  else {
    BracketIfNeeded(this,val,Indexing);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"."
                   ,&local_58);
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_f8._0_8_);
    local_138.field_2._M_allocated_capacity = local_f8._16_8_;
    _Var16._M_p = (pointer)local_f8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f8 + 0x10)) goto LAB_00132f26;
  }
  operator_delete(_Var16._M_p,
                  (ulong)((long)&(((pointer)local_138.field_2._M_allocated_capacity)->_M_dataplus).
                                 _M_p + 1));
LAB_00132f26:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LoadStore(Value& val,
                 const Node& addr_exp,
                 uint64_t offset,
                 Opcode opc,
                 Address align,
                 Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base && abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value{{dat->name}, Precedence::Atomic};
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                     ? std::to_string(offset / align)
                     : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add && shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl && const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() += cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
                          lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }